

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O3

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMethodList *stm)

{
  pointer puVar1;
  ulong uVar2;
  vector<INode_*,_std::allocator<INode_*>_> children;
  vector<INode_*,_std::allocator<INode_*>_> local_b8;
  _Head_base<0UL,_CMethod_*,_false> local_98;
  vector<INode_*,_std::allocator<INode_*>_> local_90;
  string local_78;
  ChildrenAnswers local_58;
  
  local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (INode **)0x0;
  local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (INode **)0x0;
  puVar1 = (stm->methods).
           super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((stm->methods).
      super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar1) {
    uVar2 = 0;
    do {
      local_98._M_head_impl =
           puVar1[uVar2]._M_t.super___uniq_ptr_impl<CMethod,_std::default_delete<CMethod>_>._M_t.
           super__Tuple_impl<0UL,_CMethod_*,_std::default_delete<CMethod>_>.
           super__Head_base<0UL,_CMethod_*,_false>._M_head_impl;
      if (local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<INode*,std::allocator<INode*>>::_M_realloc_insert<INode*>
                  ((vector<INode*,std::allocator<INode*>> *)&local_b8,
                   (iterator)
                   local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(INode **)&local_98);
      }
      else {
        *local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
         super__Vector_impl_data._M_finish = (INode *)local_98._M_head_impl;
        local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar2 = uVar2 + 1;
      puVar1 = (stm->methods).
               super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(stm->methods).
                                   super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3));
  }
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_90,&local_b8);
  VisitChildren(&local_58,this,&local_90);
  AddChildrenAnswers(this,&local_58);
  if (local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.descriptions);
  if (local_90.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"MethodList","");
  AddLabel(this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if (local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CPrintVisitor::Visit(CMethodList &stm) {
	std::vector<INode*> children;
	for (int index = 0; index < stm.methods.size(); ++index) {
		children.push_back(stm.methods[index].get());
	}
	AddChildrenAnswers(VisitChildren(children));
	AddLabel("MethodList");
	++lastVisited;
}